

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectWindowRewriteEList
               (Parse *pParse,Window *pWin,SrcList *pSrc,ExprList *pEList,ExprList **ppSub)

{
  Window *local_80;
  WindowRewrite sRewrite;
  Walker sWalker;
  ExprList **ppSub_local;
  ExprList *pEList_local;
  SrcList *pSrc_local;
  Window *pWin_local;
  Parse *pParse_local;
  
  memset(&sRewrite.pSubSelect,0,0x30);
  memset(&local_80,0,0x20);
  sRewrite.pSrc = (SrcList *)*ppSub;
  local_80 = pWin;
  sRewrite.pWin = (Window *)pSrc;
  sRewrite.pSubSelect = (Select *)pParse;
  sqlite3WalkExprList((Walker *)&sRewrite.pSubSelect,pEList);
  *ppSub = (ExprList *)sRewrite.pSrc;
  return;
}

Assistant:

static void selectWindowRewriteEList(
  Parse *pParse, 
  Window *pWin,
  SrcList *pSrc,
  ExprList *pEList,               /* Rewrite expressions in this list */
  ExprList **ppSub                /* IN/OUT: Sub-select expression-list */
){
  Walker sWalker;
  WindowRewrite sRewrite;

  memset(&sWalker, 0, sizeof(Walker));
  memset(&sRewrite, 0, sizeof(WindowRewrite));

  sRewrite.pSub = *ppSub;
  sRewrite.pWin = pWin;
  sRewrite.pSrc = pSrc;

  sWalker.pParse = pParse;
  sWalker.xExprCallback = selectWindowRewriteExprCb;
  sWalker.xSelectCallback = selectWindowRewriteSelectCb;
  sWalker.u.pRewrite = &sRewrite;

  (void)sqlite3WalkExprList(&sWalker, pEList);

  *ppSub = sRewrite.pSub;
}